

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_activate(ssh_sharing_state *sharestate,char *server_verstring)

{
  size_t sVar1;
  char *pcVar2;
  ssh_sharing_connstate *cs;
  int iVar3;
  bool bVar4;
  
  iVar3 = 2;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    sVar1 = strcspn(server_verstring,"-");
    server_verstring = server_verstring + ((sVar1 + 1) - (ulong)(server_verstring[sVar1] == '\0'));
  }
  pcVar2 = dupstr(server_verstring);
  sharestate->server_verstring = pcVar2;
  iVar3 = 0;
  while( true ) {
    cs = (ssh_sharing_connstate *)index234(sharestate->connections,iVar3);
    if (cs == (ssh_sharing_connstate *)0x0) {
      return;
    }
    if (cs->sent_verstring == true) break;
    share_send_verstring(cs);
    iVar3 = iVar3 + 1;
  }
  __assert_fail("!cs->sent_verstring",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                0x769,"void share_activate(ssh_sharing_state *, const char *)");
}

Assistant:

void share_activate(ssh_sharing_state *sharestate,
                    const char *server_verstring)
{
    /*
     * Indication from connection layer that we are now ready to begin
     * serving any downstreams that have already connected to us.
     */
    struct ssh_sharing_connstate *cs;
    int i;

    /*
     * Trim the server's version string down to just the software
     * version component, removing "SSH-2.0-" or whatever at the
     * front.
     */
    for (i = 0; i < 2; i++) {
        server_verstring += strcspn(server_verstring, "-");
        if (*server_verstring)
            server_verstring++;
    }

    sharestate->server_verstring = dupstr(server_verstring);

    for (i = 0; (cs = (struct ssh_sharing_connstate *)
                 index234(sharestate->connections, i)) != NULL; i++) {
        assert(!cs->sent_verstring);
        share_send_verstring(cs);
    }
}